

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::UpdateSourceProps(ALsource *source,ALCcontext *context)

{
  bool bVar1;
  Voice *pVVar2;
  undefined1 *puVar3;
  long in_RDI;
  ALsource *unaff_retaddr;
  Voice *voice;
  memory_order __b;
  ALCcontext *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar4;
  ALCcontext *in_stack_fffffffffffffff8;
  
  bVar1 = SourceShouldUpdate((ALsource *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8);
  if ((bVar1) &&
     (pVVar2 = GetSourceVoice(unaff_retaddr,in_stack_fffffffffffffff8), pVVar2 != (Voice *)0x0)) {
    UpdateSourceProps(unaff_retaddr,(Voice *)in_stack_fffffffffffffff8,
                      (ALCcontext *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  else {
    puVar3 = (undefined1 *)(in_RDI + 0x188);
    iVar4 = 3;
    std::operator&(memory_order_release,__memory_order_mask);
    if (iVar4 == 3) {
      *puVar3 = 0;
    }
    else if (iVar4 == 5) {
      LOCK();
      *puVar3 = 0;
      UNLOCK();
    }
    else {
      *puVar3 = 0;
    }
  }
  return true;
}

Assistant:

bool UpdateSourceProps(ALsource *source, ALCcontext *context)
{
    Voice *voice;
    if(SourceShouldUpdate(source, context) && (voice=GetSourceVoice(source, context)) != nullptr)
        UpdateSourceProps(source, voice, context);
    else
        source->PropsClean.clear(std::memory_order_release);
    return true;
}